

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::AddColumnInfo::Deserialize(AddColumnInfo *this,Deserializer *deserializer)

{
  AddColumnInfo *this_00;
  pointer pAVar1;
  pointer *__ptr;
  ColumnDefinition new_column;
  _Head_base<0UL,_duckdb::AddColumnInfo_*,_false> local_1d8;
  ColumnDefinition local_1d0;
  ColumnDefinition local_f8;
  
  Deserializer::ReadProperty<duckdb::ColumnDefinition>(&local_1d0,deserializer,400,"new_column");
  this_00 = (AddColumnInfo *)operator_new(0x158);
  ColumnDefinition::ColumnDefinition(&local_f8,&local_1d0);
  AddColumnInfo(this_00,&local_f8);
  local_1d8._M_head_impl = this_00;
  ColumnDefinition::~ColumnDefinition(&local_f8);
  pAVar1 = unique_ptr<duckdb::AddColumnInfo,_std::default_delete<duckdb::AddColumnInfo>,_true>::
           operator->((unique_ptr<duckdb::AddColumnInfo,_std::default_delete<duckdb::AddColumnInfo>,_true>
                       *)&local_1d8);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0x191,"if_column_not_exists",&pAVar1->if_column_not_exists);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_1d8._M_head_impl;
  ColumnDefinition::~ColumnDefinition(&local_1d0);
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> AddColumnInfo::Deserialize(Deserializer &deserializer) {
	auto new_column = deserializer.ReadProperty<ColumnDefinition>(400, "new_column");
	auto result = duckdb::unique_ptr<AddColumnInfo>(new AddColumnInfo(std::move(new_column)));
	deserializer.ReadPropertyWithDefault<bool>(401, "if_column_not_exists", result->if_column_not_exists);
	return std::move(result);
}